

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_WriteBinaryFile::test_method(util_WriteBinaryFile *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file_00;
  const_string file_01;
  check_type cVar5;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  lazy_ostream local_350;
  undefined1 *local_340;
  char **local_338;
  assertion_result local_330;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  ifstream file;
  string actual_text;
  string expected_text;
  path local_b0;
  path tmpfile;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  fs::operator/(&tmpfile,(path *)&local_b0,"write_binary.dat");
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected_text,"bitcoin",(allocator<char> *)&file);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)WriteBinaryFile(&tmpfile,&expected_text);
  actual_text._M_dataplus._M_p = (pointer)&actual_text.field_2;
  actual_text._M_string_length = 0;
  actual_text.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,tmpfile.super_path._M_pathname._M_dataplus._M_p,_S_in);
  std::operator>>((istream *)&file,(string *)&actual_text);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file_00.m_end = (iterator)0x70f;
  file_00.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,msg);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = &local_360;
  local_360 = "valid";
  local_358 = "";
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_368 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,&local_350,1,0,WARN,_cVar5,(size_t)&local_370,0x70f);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_01.m_end = (iterator)0x710;
  file_01.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_390,
             msg_00);
  local_350.m_empty = false;
  local_350._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_338 = (char **)0xc694e1;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_398 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_350,&local_3a0,0x710,1,2,&actual_text,"actual_text",&expected_text,
             "expected_text");
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&actual_text);
  std::__cxx11::string::~string((string *)&expected_text);
  std::filesystem::__cxx11::path::~path(&tmpfile.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_WriteBinaryFile)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    fs::path tmpfile = tmpfolder / "write_binary.dat";
    std::string expected_text = "bitcoin";
    auto valid = WriteBinaryFile(tmpfile, expected_text);
    std::string actual_text;
    std::ifstream file{tmpfile};
    file >> actual_text;
    BOOST_CHECK(valid);
    BOOST_CHECK_EQUAL(actual_text, expected_text);
}